

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cxx
# Opt level: O2

string * __thiscall
cmsys::Directory::GetFilePath_abi_cxx11_(string *__return_storage_ptr__,Directory *this,size_t i)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->Internal->Path);
  if ((__return_storage_ptr__->_M_string_length != 0) &&
     ((__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1] !=
      '/')) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string Directory::GetFilePath(std::size_t i) const
{
  std::string abs = this->Internal->Path;
  if (!abs.empty() && abs.back() != '/') {
    abs += '/';
  }
  abs += this->Internal->Files[i].Name;
  return abs;
}